

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::BlockImpl_dense<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false,_true>::
BlockImpl_dense(BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_true>
                *this,Matrix<float,__1,_8,_0,__1,_8> *xpr,Index startRow,Index startCol,
               Index blockRows,Index blockCols)

{
  Scalar *pSVar1;
  Index IVar2;
  Index IVar3;
  Index blockCols_local;
  Index blockRows_local;
  Index startCol_local;
  Index startRow_local;
  Matrix<float,__1,_8,_0,__1,_8> *xpr_local;
  BlockImpl_dense<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false,_true> *this_local;
  
  pSVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::data
                     (&xpr->super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>);
  IVar2 = Matrix<float,_-1,_8,_0,_-1,_8>::innerStride(xpr);
  IVar3 = Matrix<float,_-1,_8,_0,_-1,_8>::outerStride(xpr);
  MapBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_0>::MapBase
            (&this->
              super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,_0>
             ,pSVar1 + IVar2 * startRow + IVar3 * startCol,blockRows,blockCols);
  this->m_xpr = xpr;
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startRow,startRow);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_startCol,startCol);
  init(this,(EVP_PKEY_CTX *)startCol);
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(xpr.data()+xpr.innerStride()*(XprTypeIsRowMajor?startCol:startRow) + xpr.outerStride()*(XprTypeIsRowMajor?startRow:startCol), blockRows, blockCols),
        m_xpr(xpr), m_startRow(startRow), m_startCol(startCol)
    {
      init();
    }